

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  int in_EDI;
  uint in_R9D;
  byte bVar5;
  byte bVar6;
  float in_XMM0_Da;
  float fVar7;
  float in_stack_0000002c;
  float in_stack_00000030;
  bool in_stack_00000037;
  undefined4 in_stack_00000038;
  float in_stack_0000003c;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  unsigned_long_long v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float local_b0;
  float local_a8;
  float local_98;
  float local_90;
  bool local_89;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  ImGuiInputReadMode in_stack_ffffffffffffff88;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff8c;
  ulong local_68;
  ImVec2 in_stack_ffffffffffffffa8;
  float fVar8;
  undefined1 in_stack_ffffffffffffffb8;
  float local_14;
  bool local_1;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  bVar5 = in_RDX < in_RCX;
  bVar6 = (in_R9D & 0x20) != 0;
  local_89 = in_EDI == 8 || in_EDI == 9;
  local_14 = in_XMM0_Da;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && ((bool)bVar5)) &&
     (local_90 = (float)(in_RCX - in_RDX), local_90 < 3.4028235e+38)) {
    local_98 = (float)(in_RCX - in_RDX);
    local_14 = local_98 * GImGui->DragSpeedDefaultRatio;
  }
  fVar8 = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)0x0), bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), bVar2)) {
    pfVar4 = ImVec2::operator[](&(pIVar1->IO).MouseDelta,(long)(int)uVar3);
    fVar8 = *pfVar4;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      fVar8 = fVar8 * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      fVar8 = fVar8 * 10.0;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((local_89 & 1U) != 0) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (int)in_stack_ffffffffffffff44);
    }
    in_stack_ffffffffffffffa8 =
         GetNavInputAmount2d(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    pfVar4 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffa8,(long)(int)uVar3);
    fVar8 = *pfVar4;
    fVar7 = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff40);
    local_14 = ImMax<float>(local_14,fVar7);
  }
  local_14 = local_14 * fVar8;
  if (uVar3 == 1) {
    local_14 = -local_14;
  }
  if (((bVar6 & 1) != 0) && (local_a8 = (float)(in_RCX - in_RDX), local_a8 < 3.4028235e+38)) {
    in_stack_ffffffffffffff4c = (float)(long)(in_RCX - in_RDX);
    local_b0 = (float)(in_RCX - in_RDX);
    if (1e-06 < local_b0) {
      in_stack_ffffffffffffff44 = (float)(long)(in_RCX - in_RDX);
      in_stack_ffffffffffffff48 = (float)(in_RCX - in_RDX);
      local_14 = local_14 / in_stack_ffffffffffffff48;
    }
  }
  bVar2 = false;
  if (((bVar5 & 1) != 0) && ((*in_RSI < in_RCX || (bVar2 = true, local_14 <= 0.0)))) {
    bVar2 = *in_RSI <= in_RDX && local_14 < 0.0;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) != 0) || (bVar2)) {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  else if ((local_14 != 0.0) || (NAN(local_14))) {
    pIVar1->DragCurrentAccum = local_14 + pIVar1->DragCurrentAccum;
    pIVar1->DragCurrentAccumDirty = true;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    fVar8 = 0.0;
    if ((bVar6 & 1) == 0) {
      local_68 = (long)pIVar1->DragCurrentAccum + *in_RSI;
    }
    else {
      if ((local_89 & 1U) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (int)in_stack_ffffffffffffff44);
      }
      ImPow(0.0,2.374504e-39);
      fVar8 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                        ((ImGuiDataType)zero_deadzone_halfsize,_v_old_parametric,
                         CONCAT44(v_new_parametric,v_new_parametric_1),
                         CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000037,
                         in_stack_00000030,in_stack_0000002c);
      local_68 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                           (v_old_ref_for_accum_remainder._4_4_,v_old_ref_for_accum_remainder._0_4_,
                            CONCAT44(logarithmic_zero_epsilon,zero_deadzone_halfsize),
                            _v_old_parametric,v_new_parametric._3_1_,v_new_parametric_1,
                            in_stack_0000003c);
    }
    if ((in_R9D & 0x40) == 0) {
      local_68 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                           ((char *)CONCAT44(uVar3,CONCAT13(bVar5,CONCAT12(bVar6,CONCAT11(local_89,
                                                  in_stack_ffffffffffffffb8)))),
                            (ImGuiDataType)local_14,(unsigned_long_long)in_stack_ffffffffffffffa8);
    }
    pIVar1->DragCurrentAccumDirty = false;
    if ((bVar6 & 1) == 0) {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(long)(local_68 - *in_RSI);
    }
    else {
      fVar7 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                        ((ImGuiDataType)zero_deadzone_halfsize,_v_old_parametric,
                         CONCAT44(v_new_parametric,v_new_parametric_1),
                         CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000037,
                         in_stack_00000030,in_stack_0000002c);
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (fVar7 - fVar8);
    }
    if (local_68 == 0) {
      local_68 = 0;
    }
    if ((*in_RSI != local_68) && ((bVar5 & 1) != 0)) {
      if ((local_68 < in_RDX) ||
         (((*in_RSI < local_68 && (local_14 < 0.0)) && ((local_89 & 1U) == 0)))) {
        local_68 = in_RDX;
      }
      if ((in_RCX < local_68) ||
         (((local_68 < *in_RSI && (0.0 < local_14)) && ((local_89 & 1U) == 0)))) {
        local_68 = in_RCX;
      }
    }
    if (*in_RSI == local_68) {
      local_1 = false;
    }
    else {
      *in_RSI = local_68;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}